

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

void __thiscall
gl4cts::GLSL420Pack::BindingImagesTest::prepareUniforms(BindingImagesTest *this,program *program)

{
  BindingImagesTest *this_00;
  
  this_00 = this;
  BindingImageTest::prepareBuffer(&this->super_BindingImageTest,&this->m_goku_buffer,0xff);
  BindingImageTest::prepareBuffer(&this_00->super_BindingImageTest,&this->m_vegeta_buffer,0xff00);
  BindingImageTest::prepareBuffer(&this_00->super_BindingImageTest,&this->m_trunks_buffer,0xff0000);
  BindingImageTest::prepareTexture
            (&this->super_BindingImageTest,&this->m_goku_texture,&this->m_goku_buffer,
             this->m_test_case,0xff,1);
  BindingImageTest::prepareTexture
            (&this->super_BindingImageTest,&this->m_vegeta_texture,&this->m_vegeta_buffer,
             this->m_test_case,0xff00,2);
  BindingImageTest::prepareTexture
            (&this->super_BindingImageTest,&this->m_trunks_texture,&this->m_trunks_buffer,
             this->m_test_case,0xff0000,4);
  return;
}

Assistant:

void BindingImagesTest::prepareUniforms(Utils::program& program)
{
	(void)program;
	prepareBuffer(m_goku_buffer, m_goku_data);
	prepareBuffer(m_vegeta_buffer, m_vegeta_data);
	prepareBuffer(m_trunks_buffer, m_trunks_data);

	prepareTexture(m_goku_texture, m_goku_buffer, m_test_case, m_goku_data, 1);
	prepareTexture(m_vegeta_texture, m_vegeta_buffer, m_test_case, m_vegeta_data, 2);
	prepareTexture(m_trunks_texture, m_trunks_buffer, m_test_case, m_trunks_data, 4);
}